

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

Txid * __thiscall cfd::core::Block::GetTxid(Txid *__return_storage_ptr__,Block *this,uint32_t index)

{
  pointer pTVar1;
  CfdException *this_00;
  allocator local_39;
  string local_38;
  
  pTVar1 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (index < (uint)((ulong)((long)(this->txids_).
                                   super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) >> 5))
  {
    Txid::Txid(__return_storage_ptr__,pTVar1 + index);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_38,"The index is outside the scope of the txid list.",&local_39);
  CfdException::CfdException(this_00,kCfdOutOfRangeError,&local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Txid Block::GetTxid(uint32_t index) const {
  if (static_cast<uint32_t>(txids_.size()) <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "The index is outside the scope of the txid list.");
  }
  return txids_[index];
}